

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O1

Value * __thiscall
anon_unknown.dwarf_14e4e6f::Target::DumpSource
          (Value *__return_storage_ptr__,Target *this,SourceAndKind *sk,ArrayIndex si)

{
  _Rb_tree_header *__key;
  _Base_ptr *pp_Var1;
  unordered_map<(anonymous_namespace)::CompileData,_unsigned_int,_std::hash<(anonymous_namespace)::CompileData>,_std::equal_to<(anonymous_namespace)::CompileData>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>_>
  *this_00;
  __node_base *p_Var2;
  size_type *psVar3;
  pointer *ppCVar4;
  pointer *ppSVar5;
  _Rb_tree_node_base *p_Var6;
  uint uVar7;
  UInt value;
  _Hash_node_base *p_Var8;
  SourceGroup *__a;
  SourceGroup *pSVar9;
  cmGeneratorTarget *headTarget;
  pointer pBVar10;
  pointer pCVar11;
  pointer pCVar12;
  __buckets_ptr pp_Var13;
  ValueHolder *pVVar14;
  ValueHolder *pVVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  size_type sVar19;
  CompileData *__k;
  pointer pJVar20;
  pointer pJVar21;
  pointer __first;
  pointer pbVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  bool bVar24;
  string *psVar25;
  Value *pVVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  _Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false> _Var28;
  pointer pSVar29;
  cmLocalGenerator *localGenerator;
  cmValue cVar30;
  iterator iVar31;
  pointer __result;
  pointer pIVar32;
  undefined8 uVar33;
  long *plVar34;
  undefined8 uVar35;
  ulong uVar36;
  pointer pJVar37;
  pointer pJVar38;
  __hash_code _Var39;
  ValueHolder VVar40;
  ValueHolder VVar41;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var42;
  ValueHolder *pVVar43;
  JBTIndex *__args_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__args_1_00;
  _Tp_alloc_type *__alloc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar44;
  ulong uVar45;
  SourceGroup *__args;
  SourceGroup *extraout_RDX;
  SourceGroup *extraout_RDX_00;
  SourceGroup *extraout_RDX_01;
  SourceGroup *extraout_RDX_02;
  SourceGroup *pSVar46;
  size_type __n;
  pointer arch;
  pointer pBVar47;
  ulong uVar48;
  pointer __a_00;
  pointer pcVar49;
  Target *__n_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar50;
  _Hash_node_base _Var51;
  __node_base_ptr p_Var52;
  __node_base_ptr p_Var53;
  ValueHolder *pVVar54;
  SourceGroup *pSVar55;
  long lVar56;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar57;
  _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
  *this_01;
  _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var58;
  ValueHolder *pVVar59;
  pair<std::__detail::_Node_iterator<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false,_false>,_bool>
  pVar60;
  undefined1 auVar61 [16];
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fileDefines;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configFileDefines;
  string tmp;
  string defPropName;
  string COMPILE_OPTIONS;
  string COMPILE_DEFINITIONS;
  string tmp_1;
  SourceGroup g;
  cmGeneratorExpressionInterpreter genexInterpreter;
  ArrayIndex sgIndex;
  bool isSystemInclude;
  string COMPILE_FLAGS;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  architectures;
  string path;
  undefined1 local_538 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  _Alloc_hider local_518;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  undefined1 local_4f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d0;
  cmSourceFile *local_4c8;
  undefined1 local_4c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b0;
  _Rb_tree_node_base *local_4a0;
  size_t local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_470;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_468;
  string local_460;
  ArrayIndex local_43c;
  undefined1 local_438 [40];
  string local_410;
  ValueHolder local_3f0;
  _Base_ptr local_3e8;
  ValueHolder local_3e0;
  _Base_ptr p_Stack_3d8;
  ValueHolder local_3d0;
  _Hash_node_base *local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b0;
  _Hash_node_base *local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  _Hash_node_base *local_390;
  _Hash_node_base *p_Stack_388;
  CompileData *local_380;
  pointer pJStack_378;
  pointer local_370;
  pointer pJStack_368;
  pointer local_360;
  pointer pJStack_358;
  pointer local_350;
  _Hash_node_base *p_Stack_348;
  _Hash_node_base *local_340;
  _Hash_node_base *p_Stack_338;
  pointer local_330;
  pointer pIStack_328;
  pointer local_320;
  ValueHolder local_318;
  ValueHolder local_310;
  undefined1 local_308 [88];
  undefined1 local_2b0 [17];
  undefined7 uStack_29f;
  undefined8 uStack_298;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined8 local_288;
  char acStack_280 [8];
  undefined1 local_278 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  string local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  ulong local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  char local_1c8;
  undefined7 uStack_1c7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  char *local_198;
  undefined8 local_190;
  char local_188;
  undefined7 uStack_187;
  long lStack_180;
  string local_178;
  pointer local_158;
  pointer local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  ulong local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_68;
  Value local_58;
  
  local_43c = si;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  psVar25 = cmSourceFile::ResolveFullPath((sk->Source).Value,(string *)0x0,(string *)0x0);
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  pcVar49 = (psVar25->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar49,pcVar49 + psVar25->_M_string_length);
  cmSystemTools::RelativeIfUnder((string *)&local_318,&this->TopSource,&local_218);
  Json::Value::Value((Value *)&local_3f0,(String *)&local_318);
  pVVar26 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(pVVar26,(Value *)&local_3f0);
  Json::Value::~Value((Value *)&local_3f0);
  if (local_318 != (__node_ptr)local_308) {
    operator_delete(local_318.string_,CONCAT71(local_308._1_7_,local_308[0]) + 1);
  }
  bVar24 = cmSourceFile::GetIsGenerated((sk->Source).Value,GlobalAndLocal);
  if (bVar24) {
    Json::Value::Value((Value *)&local_3f0,true);
    pVVar26 = Json::Value::operator[](__return_storage_ptr__,"isGenerated");
    Json::Value::operator=(pVVar26,(Value *)&local_3f0);
    Json::Value::~Value((Value *)&local_3f0);
  }
  AddBacktrace(this,__return_storage_ptr__,&(sk->Source).Backtrace);
  paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmMakefile::FindSourceGroup(this->GT->Makefile,&local_218,&this->SourceGroupsLocal);
  if (paVar27 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    uVar36 = (this->SourceGroupsMap)._M_h._M_bucket_count;
    uVar45 = (ulong)paVar27 % uVar36;
    p_Var52 = (this->SourceGroupsMap)._M_h._M_buckets[uVar45];
    p_Var53 = (__node_base_ptr)0x0;
    if ((p_Var52 != (__node_base_ptr)0x0) &&
       (p_Var8 = p_Var52->_M_nxt, p_Var53 = p_Var52,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)p_Var52->_M_nxt[1]._M_nxt != paVar27)) {
      while (p_Var52 = p_Var8, p_Var8 = p_Var52->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
        p_Var53 = (__node_base_ptr)0x0;
        if (((ulong)p_Var8[1]._M_nxt % uVar36 != uVar45) ||
           (p_Var53 = p_Var52,
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)p_Var8[1]._M_nxt == paVar27)) goto LAB_003b27f3;
      }
      p_Var53 = (__node_base_ptr)0x0;
    }
LAB_003b27f3:
    if (p_Var53 == (__node_base_ptr)0x0) {
      _Var28._M_cur = (__node_type *)0x0;
    }
    else {
      _Var28._M_cur = (__node_type *)p_Var53->_M_nxt;
    }
    local_538._0_8_ = paVar27;
    if (_Var28._M_cur == (__node_type *)0x0) {
      local_2b0._0_4_ =
           (int)((ulong)((long)(this->SourceGroups).
                               super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->SourceGroups).
                              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      pVar60 = std::
               _Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               ::_M_emplace<cmSourceGroup*&,unsigned_int&>
                         ((_Hashtable<cmSourceGroup_const*,std::pair<cmSourceGroup_const*const,unsigned_int>,std::allocator<std::pair<cmSourceGroup_const*const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<cmSourceGroup_const*>,std::hash<cmSourceGroup_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                           *)&this->SourceGroupsMap,local_538);
      _Var28._M_cur =
           (__node_type *)
           pVar60.first.
           super__Node_iterator_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>.
           _M_cur;
      local_3f0.string_ = (char *)&local_3e0;
      local_3e8 = (_Base_ptr)0x0;
      local_3e0.bool_ = false;
      Json::Value::Value((Value *)&local_3d0,arrayValue);
      cmSourceGroup::GetFullName_abi_cxx11_((cmSourceGroup *)local_538._0_8_);
      std::__cxx11::string::_M_assign((string *)&local_3f0.bool_);
      __a = (this->SourceGroups).
            super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      if (__a == (this->SourceGroups).
                 super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        pSVar9 = (this->SourceGroups).
                 super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)__a - (long)pSVar9 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        lVar56 = (long)__a - (long)pSVar9 >> 3;
        uVar45 = lVar56 * -0x71c71c71c71c71c7;
        uVar36 = 1;
        if (__a != pSVar9) {
          uVar36 = uVar45;
        }
        uVar48 = uVar36 + uVar45;
        if (0x1c71c71c71c71c6 < uVar48) {
          uVar48 = 0x1c71c71c71c71c7;
        }
        if (CARRY8(uVar36,uVar45)) {
          uVar48 = 0x1c71c71c71c71c7;
        }
        if (uVar48 == 0) {
          pSVar29 = (pointer)0x0;
          pSVar46 = pSVar9;
        }
        else {
          pSVar29 = (pointer)operator_new(uVar48 * 0x48);
          pSVar46 = extraout_RDX;
        }
        std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
        construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                  ((allocator_type *)(&(pSVar29->Name)._M_dataplus + lVar56),
                   (SourceGroup *)&local_3f0,pSVar46);
        __a_00 = pSVar29;
        if (__a != pSVar9) {
          pSVar46 = extraout_RDX_00;
          paVar27 = &(pSVar9->Name).field_2;
          do {
            std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
            construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                      ((allocator_type *)__a_00,(SourceGroup *)(paVar27->_M_local_buf + -0x10),
                       pSVar46);
            Json::Value::~Value((Value *)(paVar27->_M_local_buf + 0x10));
            pSVar46 = extraout_RDX_01;
            if (paVar27 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*(long **)(paVar27->_M_local_buf + -0x10)) {
              operator_delete(*(long **)(paVar27->_M_local_buf + -0x10),
                              paVar27->_M_allocated_capacity + 1);
              pSVar46 = extraout_RDX_02;
            }
            __a_00 = __a_00 + 1;
            pSVar55 = (SourceGroup *)(paVar27->_M_local_buf + 0x38);
            paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar27->_M_local_buf + 0x48);
          } while (pSVar55 != __a);
        }
        if (pSVar9 != (SourceGroup *)0x0) {
          operator_delete(pSVar9,(long)(this->SourceGroups).
                                       super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pSVar9);
        }
        (this->SourceGroups).
        super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
        ._M_impl.super__Vector_impl_data._M_start = pSVar29;
        (this->SourceGroups).
        super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
        ._M_impl.super__Vector_impl_data._M_finish = __a_00 + 1;
        (this->SourceGroups).
        super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar29 + uVar48;
      }
      else {
        std::allocator_traits<std::allocator<(anonymous_namespace)::Target::SourceGroup>>::
        construct<(anonymous_namespace)::Target::SourceGroup,(anonymous_namespace)::Target::SourceGroup>
                  ((allocator_type *)__a,(SourceGroup *)&local_3f0,__args);
        ppSVar5 = &(this->SourceGroups).
                   super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar5 = *ppSVar5 + 1;
      }
      Json::Value::~Value((Value *)&local_3d0);
      if (local_3f0 != &local_3e0) {
        operator_delete(local_3f0.string_,CONCAT71(local_3e0.int_._1_7_,local_3e0.bool_) + 1);
      }
    }
    uVar7 = *(uint *)((long)&((_Var28._M_cur)->
                             super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                             ).
                             super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                             ._M_storage._M_storage + 8);
    pSVar29 = (this->SourceGroups).
              super__Vector_base<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
              ._M_impl.super__Vector_impl_data._M_start;
    Json::Value::Value((Value *)&local_3f0,local_43c);
    Json::Value::append(&pSVar29[uVar7].SourceIndexes,(Value *)&local_3f0);
    Json::Value::~Value((Value *)&local_3f0);
    Json::Value::Value((Value *)&local_318,
                       *(UInt *)((long)&((_Var28._M_cur)->
                                        super__Hash_node_value<std::pair<const_cmSourceGroup_*const,_unsigned_int>,_false>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_cmSourceGroup_*const,_unsigned_int>_>
                                        ._M_storage._M_storage + 8));
    pVVar26 = Json::Value::operator[](__return_storage_ptr__,"sourceGroupIndex");
    Json::Value::operator=(pVVar26,(Value *)&local_318);
    Json::Value::~Value((Value *)&local_318);
  }
  if (sk->Kind != SourceKindObjectSource) goto LAB_003b4aad;
  local_4c8 = (sk->Source).Value;
  local_3f0.string_ = (char *)&local_3e0;
  local_3e8 = (_Base_ptr)0x0;
  local_3e0.bool_ = false;
  local_3d0.string_ = (char *)&local_3c0;
  local_3c8 = (_Hash_node_base *)0x0;
  local_3c0._M_local_buf[0] = '\0';
  local_310.int_ = 0;
  local_3b0 = &local_3a0;
  local_3a0._M_local_buf[0] = '\0';
  local_3a0._M_allocated_capacity._1_7_ = local_308._1_7_;
  local_3a0._M_local_buf[8] = local_308[8];
  local_3a0._9_4_ = local_308._9_4_;
  local_3a0._13_2_ = local_308._13_2_;
  local_3a0._M_local_buf[0xf] = local_308[0xf];
  local_3a8 = (_Hash_node_base *)0x0;
  local_308[0] = 0;
  local_320 = (pointer)0x0;
  local_330 = (pointer)0x0;
  pIStack_328 = (pointer)0x0;
  local_340 = (_Hash_node_base *)0x0;
  p_Stack_338 = (_Hash_node_base *)0x0;
  local_350 = (pointer)0x0;
  p_Stack_348 = (_Hash_node_base *)0x0;
  local_360 = (pointer)0x0;
  pJStack_358 = (pointer)0x0;
  local_370 = (pointer)0x0;
  pJStack_368 = (pointer)0x0;
  local_380 = (CompileData *)0x0;
  pJStack_378 = (pointer)0x0;
  local_390 = (_Hash_node_base *)0x0;
  p_Stack_388 = (_Hash_node_base *)0x0;
  local_318.string_ = local_308;
  paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(local_4c8);
  std::__cxx11::string::_M_assign((string *)&local_3f0.bool_);
  if (local_3e8 != (_Base_ptr)0x0) {
    localGenerator = cmGeneratorTarget::GetLocalGenerator(this->GT);
    pcVar49 = (this->Config->_M_dataplus)._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar49,pcVar49 + this->Config->_M_string_length);
    headTarget = this->GT;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_3f0.int_,(long)&local_3e8->_M_color + local_3f0.string_);
    cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
              ((cmGeneratorExpressionInterpreter *)&local_318,localGenerator,&local_88,headTarget,
               &local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    paVar27 = &local_248;
    local_248._M_allocated_capacity._0_5_ = 0x49504d4f43;
    local_248._M_allocated_capacity._5_3_ = 0x5f454c;
    local_248._8_5_ = 0x5347414c46;
    local_278._40_8_ = 0xd;
    local_248._M_local_buf[0xd] = '\0';
    local_278._32_8_ = paVar27;
    cVar30 = cmSourceFile::GetProperty(local_4c8,(string *)(local_278 + 0x20));
    if (cVar30.Value != (string *)0x0) {
      pcVar49 = ((cVar30.Value)->_M_dataplus)._M_p;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar49,pcVar49 + (cVar30.Value)->_M_string_length);
      psVar25 = cmGeneratorExpressionInterpreter::Evaluate
                          ((cmGeneratorExpressionInterpreter *)&local_318,&local_c8,
                           (string *)(local_278 + 0x20));
      local_538._0_8_ = local_538 + 0x10;
      pcVar49 = (psVar25->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_538,pcVar49,pcVar49 + psVar25->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        pcVar49 = (pointer)(local_c8.field_2._M_allocated_capacity + 1);
        operator_delete(local_c8._M_dataplus._M_p,(ulong)pcVar49);
      }
      pJVar21 = local_370;
      pJVar20 = pJStack_378;
      local_2b0._0_4_ = 0xffffffff;
      if (local_370 == pJStack_368) {
        lVar56 = (long)local_370 - (long)pJStack_378;
        if (lVar56 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __args_1 = (JBTIndex *)((lVar56 >> 3) * -0x3333333333333333);
        uVar36 = (long)&__args_1->Index + (ulong)(__args_1 == (JBTIndex *)0x0);
        p_Var58 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&__args_1->Index + uVar36);
        if ((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x333333333333332 < p_Var58) {
          p_Var58 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x333333333333333;
        }
        if (CARRY8(uVar36,(ulong)__args_1)) {
          p_Var58 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x333333333333333;
        }
        pJVar37 = std::
                  _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::_M_allocate(p_Var58,(size_t)pcVar49);
        std::allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
        construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string,(anonymous_namespace)::JBTIndex>
                  ((allocator_type *)(lVar56 + (long)pJVar37),
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_538,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                   __args_1);
        pJVar38 = pJVar37;
        if (pJVar20 != pJVar21) {
          paVar27 = &(pJVar20->Value).field_2;
          paVar44 = &(pJVar37->Value).field_2;
          do {
            paVar50 = paVar44;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar50 + -1))->
            _M_dataplus)._M_p = (pointer)paVar50;
            pcVar49 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (paVar27 + -1))->_M_dataplus)._M_p;
            if (paVar27 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar49) {
              uVar16 = *(undefined4 *)((long)paVar27 + 4);
              uVar17 = *(undefined4 *)((long)paVar27 + 8);
              uVar18 = *(undefined4 *)((long)paVar27 + 0xc);
              *(undefined4 *)paVar50 = *(undefined4 *)paVar27;
              *(undefined4 *)((long)paVar50 + 4) = uVar16;
              *(undefined4 *)((long)paVar50 + 8) = uVar17;
              *(undefined4 *)((long)paVar50 + 0xc) = uVar18;
            }
            else {
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar50 + -1))
              ->_M_dataplus)._M_p = pcVar49;
              paVar50->_M_allocated_capacity = paVar27->_M_allocated_capacity;
            }
            *(size_type *)((long)paVar50 + -8) = *(size_type *)((long)paVar27 + -8);
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar27 + -1))->
            _M_dataplus)._M_p = (pointer)paVar27;
            *(size_type *)((long)paVar27 + -8) = 0;
            paVar27->_M_local_buf[0] = '\0';
            *(undefined4 *)(paVar50 + 1) = *(undefined4 *)(paVar27 + 1);
            pJVar38 = (pointer)((long)paVar27 + 0x18);
            paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar27 + 0x28);
            paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar50 + 0x28);
          } while (pJVar38 != pJVar21);
          pJVar38 = (pointer)((long)paVar50 + 0x18);
        }
        if (pJVar20 != (pointer)0x0) {
          operator_delete(pJVar20,(long)pJStack_368 - (long)pJVar20);
        }
        pJStack_368 = pJVar37 + (long)p_Var58;
        pJStack_378 = pJVar37;
      }
      else {
        std::allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
        construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string,(anonymous_namespace)::JBTIndex>
                  ((allocator_type *)local_370,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_538,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                   (JBTIndex *)paVar27);
        pJVar38 = local_370;
      }
      local_370 = pJVar38 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_538._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_538 + 0x10)) {
        operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
      }
    }
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
    local_460.field_2._M_allocated_capacity._0_7_ = 0x454c49504d4f43;
    local_460.field_2._M_local_buf[7] = '_';
    local_460.field_2._8_7_ = 0x534e4f4954504f;
    local_460._M_string_length = 0xf;
    local_460.field_2._M_local_buf[0xf] = '\0';
    pBVar47 = (local_4c8->CompileOptions).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar10 = (local_4c8->CompileOptions).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar47 != pBVar10) {
      do {
        local_538._0_8_ = local_538 + 0x10;
        pcVar49 = (pBVar47->Value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,pcVar49,pcVar49 + (pBVar47->Value)._M_string_length);
        local_518._M_p =
             (pointer)(pBVar47->Backtrace).
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
        p_Stack_510 = (pBVar47->Backtrace).
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        if (p_Stack_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_510->_M_use_count = p_Stack_510->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_510->_M_use_count = p_Stack_510->_M_use_count + 1;
          }
        }
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_538._0_8_,(char *)(local_538._0_8_ + local_538._8_8_))
        ;
        cmGeneratorExpressionInterpreter::Evaluate
                  ((cmGeneratorExpressionInterpreter *)&local_318,&local_178,&local_460);
        std::__cxx11::string::_M_assign((string *)local_538);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        local_4c0._0_8_ = &local_4b0;
        local_4c0._8_8_ = 0;
        local_4b0._M_allocated_capacity = local_4b0._M_allocated_capacity & 0xffffffffffffff00;
        cmLocalGenerator::AppendCompileOptions
                  (localGenerator,(string *)local_4c0,(string *)local_538,(char *)0x0);
        local_198 = &local_188;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_4c0._0_8_,(pointer)(local_4c0._0_8_ + local_4c0._8_8_)
                  );
        if (p_Stack_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_510->_M_use_count = p_Stack_510->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_510->_M_use_count = p_Stack_510->_M_use_count + 1;
          }
        }
        if (local_198 == &local_188) {
          uStack_298 = lStack_180;
          local_2b0._0_8_ = local_2b0 + 0x10;
        }
        else {
          local_2b0._0_8_ = local_198;
        }
        uStack_29f = uStack_187;
        local_2b0[0x10] = local_188;
        local_2b0._8_8_ = local_190;
        local_190 = 0;
        local_188 = '\0';
        _local_290 = local_518._M_p;
        local_288 = p_Stack_510;
        local_198 = &local_188;
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_4f8,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_2b0);
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&pJStack_378,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_4f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._0_8_ != &local_4e8) {
          operator_delete((void *)local_4f8._0_8_,local_4e8._M_allocated_capacity + 1);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288);
        }
        if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
          operator_delete((void *)local_2b0._0_8_,stack0xfffffffffffffd60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._0_8_ != &local_4b0) {
          operator_delete((void *)local_4c0._0_8_,local_4b0._M_allocated_capacity + 1);
        }
        if (p_Stack_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_510);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_538 + 0x10)) {
          operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
        }
        pBVar47 = pBVar47 + 1;
      } while (pBVar47 != pBVar10);
    }
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_238.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmGeneratorTarget::GetAppleArchs(this->GT,this->Config,&local_238);
    if (local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&local_238);
    }
    pbVar22 = local_238.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_2b0._0_8_ = acStack_280;
    local_2b0._8_8_ = 1;
    stack0xfffffffffffffd60 = 0;
    uStack_298 = 0;
    local_290 = 0x3f800000;
    local_288 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    acStack_280[0] = '\0';
    acStack_280[1] = '\0';
    acStack_280[2] = '\0';
    acStack_280[3] = '\0';
    acStack_280[4] = '\0';
    acStack_280[5] = '\0';
    acStack_280[6] = '\0';
    acStack_280[7] = '\0';
    if (local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_238.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      arch = local_238.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmGeneratorTarget::GetPchSource
                  ((string *)local_4f8,this->GT,this->Config,(string *)&local_3f0,arch);
        if (local_4f8._8_8_ != 0) {
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_538,(string *)local_4f8,arch);
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_2b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._M_p != &local_508) {
            operator_delete(local_518._M_p,local_508._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_538 + 0x10)) {
            operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._0_8_ != &local_4e8) {
          operator_delete((void *)local_4f8._0_8_,local_4e8._M_allocated_capacity + 1);
        }
        arch = arch + 1;
      } while (arch != pbVar22);
    }
    if (uStack_298 == 0) {
      bVar24 = false;
    }
    else {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      local_538._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x17;
      local_e8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_e8,(ulong)local_538);
      local_e8.field_2._M_allocated_capacity = local_538._0_8_;
      builtin_strncpy(local_e8._M_dataplus._M_p,"SKIP_PRECOMPILE_HEADERS",0x17);
      local_e8._M_string_length = local_538._0_8_;
      local_e8._M_dataplus._M_p[local_538._0_8_] = '\0';
      cVar30 = cmSourceFile::GetProperty(local_4c8,&local_e8);
      bVar24 = cVar30.Value == (string *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        (ulong)(local_e8.field_2._M_allocated_capacity + 1));
      }
    }
    local_490._M_allocated_capacity = (size_type)&local_480;
    if (bVar24) {
      local_490._8_8_ = 0;
      local_480._M_allocated_capacity = local_480._M_allocated_capacity & 0xffffffffffffff00;
      psVar25 = cmSourceFile::ResolveFullPath(local_4c8,(string *)0x0,(string *)0x0);
      iVar31 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_2b0,psVar25);
      if (iVar31.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_4f8._8_8_ = 0;
        local_4e8._M_allocated_capacity = local_4e8._M_allocated_capacity & 0xffffffffffffff00;
        local_4f8._0_8_ = &local_4e8;
        cmGeneratorTarget::GetPchUseCompileOptions
                  ((string *)local_538,this->GT,this->Config,(string *)&local_3f0,
                   (string *)local_4f8);
        std::__cxx11::string::operator=((string *)local_490._M_local_buf,(string *)local_538);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_538 + 0x10)) {
          operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
        }
        local_528._M_allocated_capacity = local_4e8._M_allocated_capacity;
        paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4f8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._0_8_ != &local_4e8) goto LAB_003b3499;
      }
      else {
        cmGeneratorTarget::GetPchCreateCompileOptions
                  ((string *)local_538,this->GT,this->Config,(string *)&local_3f0,
                   (string *)
                   ((long)iVar31.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                          ._M_cur + 0x28));
        std::__cxx11::string::operator=((string *)local_490._M_local_buf,(string *)local_538);
        paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_538._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_538 + 0x10)) {
LAB_003b3499:
          operator_delete(paVar27,local_528._M_allocated_capacity + 1);
        }
      }
      local_1d8._M_allocated_capacity = (size_type)&local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,local_490._M_allocated_capacity,
                 local_490._8_8_ + local_490._M_allocated_capacity);
      local_68.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_68.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_68);
      uVar33 = local_1d8._8_8_;
      if ((char *)local_1d8._M_allocated_capacity == &local_1c8) {
        local_528._8_8_ = paStack_1c0;
        local_538._0_8_ = local_538 + 0x10;
      }
      else {
        local_538._0_8_ = local_1d8._M_allocated_capacity;
      }
      local_528._M_allocated_capacity._1_7_ = uStack_1c7;
      local_528._M_local_buf[0] = local_1c8;
      local_538._8_8_ = local_1d8._8_8_;
      local_1d8._8_8_ = 0;
      local_1c8 = '\0';
      local_518._M_p =
           (pointer)local_68.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      p_Stack_510 = local_68.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      local_68.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_68.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1d8._M_allocated_capacity = (size_type)&local_1c8;
      local_108._M_allocated_capacity = (size_type)&local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_538._0_8_,(char *)(local_538._0_8_ + uVar33));
      cmGeneratorExpressionInterpreter::Evaluate
                ((cmGeneratorExpressionInterpreter *)&local_318,(string *)&local_108,&local_460);
      std::__cxx11::string::_M_assign((string *)local_538);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_allocated_capacity != &local_f8) {
        operator_delete((void *)local_108._M_allocated_capacity,local_f8._M_allocated_capacity + 1);
      }
      local_410._M_string_length = 0;
      local_410.field_2._M_local_buf[0] = '\0';
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      cmLocalGenerator::AppendCompileOptions
                (localGenerator,&local_410,(string *)local_538,(char *)0x0);
      local_148 = &local_138;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,local_410._M_dataplus._M_p,
                 local_410._M_dataplus._M_p + local_410._M_string_length);
      if (p_Stack_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Stack_510->_M_use_count = p_Stack_510->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Stack_510->_M_use_count = p_Stack_510->_M_use_count + 1;
        }
      }
      if (local_148 == &local_138) {
        local_4e8._8_8_ = local_138._8_8_;
        local_4f8._0_8_ = &local_4e8;
      }
      else {
        local_4f8._0_8_ = local_148;
      }
      local_4e8._M_allocated_capacity._1_7_ = local_138._M_allocated_capacity._1_7_;
      local_4e8._M_local_buf[0] = local_138._M_local_buf[0];
      local_4f8._8_8_ = local_140;
      local_140 = 0;
      local_138._M_local_buf[0] = '\0';
      local_4d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_518._M_p;
      local_4d0._M_pi = p_Stack_510;
      local_148 = &local_138;
      (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_4c0,this,
                 (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_4f8);
      std::
      vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
      ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                  *)&pJStack_378,
                 (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_4c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4c0._0_8_ != &local_4b0) {
        operator_delete((void *)local_4c0._0_8_,local_4b0._M_allocated_capacity + 1);
      }
      if (local_4d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d0._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f8._0_8_ != &local_4e8) {
        operator_delete((void *)local_4f8._0_8_,local_4e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,
                        CONCAT71(local_410.field_2._M_allocated_capacity._1_7_,
                                 local_410.field_2._M_local_buf[0]) + 1);
      }
      if (p_Stack_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_510);
      }
      if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
        operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_allocated_capacity != &local_480) {
        operator_delete((void *)local_490._M_allocated_capacity,local_480._M_allocated_capacity + 1)
        ;
      }
    }
    local_490._M_allocated_capacity = (size_type)&local_480;
    local_538._0_8_ = (pointer)0x13;
    local_490._M_allocated_capacity =
         std::__cxx11::string::_M_create(&local_490._M_allocated_capacity,(ulong)local_538);
    local_480._M_allocated_capacity = local_538._0_8_;
    *(undefined8 *)local_490._M_allocated_capacity = 0x5f4544554c434e49;
    *(char *)(local_490._M_allocated_capacity + 8) = 'D';
    *(char *)(local_490._M_allocated_capacity + 9) = 'I';
    *(char *)(local_490._M_allocated_capacity + 10) = 'R';
    *(char *)(local_490._M_allocated_capacity + 0xb) = 'E';
    *(char *)(local_490._M_allocated_capacity + 0xc) = 'C';
    *(char *)(local_490._M_allocated_capacity + 0xd) = 'T';
    *(char *)(local_490._M_allocated_capacity + 0xe) = 'O';
    *(char *)(local_490._M_allocated_capacity + 0xf) = 'R';
    *(char *)(local_490._M_allocated_capacity + 0xf) = 'R';
    *(char *)(local_490._M_allocated_capacity + 0x10) = 'I';
    *(char *)(local_490._M_allocated_capacity + 0x11) = 'E';
    *(char *)(local_490._M_allocated_capacity + 0x12) = 'S';
    local_490._8_8_ = local_538._0_8_;
    *(char *)(local_490._M_allocated_capacity + local_538._0_8_) = '\0';
    pBVar47 = (local_4c8->IncludeDirectories).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_158 = (local_4c8->IncludeDirectories).
                super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar47 != local_158) {
      do {
        local_538._0_8_ = local_538 + 0x10;
        pcVar49 = (pBVar47->Value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_538,pcVar49,pcVar49 + (pBVar47->Value)._M_string_length);
        local_518._M_p =
             (pointer)(pBVar47->Backtrace).
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
        p_Stack_510 = (pBVar47->Backtrace).
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        if (p_Stack_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Stack_510->_M_use_count = p_Stack_510->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Stack_510->_M_use_count = p_Stack_510->_M_use_count + 1;
          }
        }
        local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_410,local_538._0_8_,(pointer)(local_538._0_8_ + local_538._8_8_)
                  );
        cmGeneratorExpressionInterpreter::Evaluate
                  ((cmGeneratorExpressionInterpreter *)&local_318,&local_410,(string *)&local_490);
        std::__cxx11::string::_M_assign((string *)local_538);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_410._M_dataplus._M_p != &local_410.field_2) {
          operator_delete(local_410._M_dataplus._M_p,
                          CONCAT71(local_410.field_2._M_allocated_capacity._1_7_,
                                   local_410.field_2._M_local_buf[0]) + 1);
        }
        local_438._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_438._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_438._16_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_150 = pBVar47;
        cmLocalGenerator::AppendIncludeDirectories
                  (localGenerator,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_438,(string *)local_538,local_4c8);
        uVar33 = local_438._8_8_;
        for (paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_438._0_8_;
            paVar27 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar33;
            paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(paVar27->_M_local_buf + 0x20)) {
          bVar24 = cmGeneratorTarget::IsSystemIncludeDirectory
                             (this->GT,(string *)paVar27,this->Config,(string *)&local_3f0);
          local_278[0] = bVar24;
          local_1f8 = &local_1e8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1f8,paVar27->_M_allocated_capacity,
                     paVar27->_M_allocated_capacity + *(size_type *)((long)paVar27 + 8));
          if (p_Stack_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Stack_510->_M_use_count = p_Stack_510->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Stack_510->_M_use_count = p_Stack_510->_M_use_count + 1;
            }
          }
          if (local_1f8 == &local_1e8) {
            local_4e8._8_8_ = local_1e8._8_8_;
            local_4f8._0_8_ = &local_4e8;
          }
          else {
            local_4f8._0_8_ = local_1f8;
          }
          local_4e8._M_allocated_capacity._1_7_ = local_1e8._M_allocated_capacity._1_7_;
          local_4e8._M_local_buf[0] = local_1e8._M_local_buf[0];
          local_4f8._8_8_ = local_1f0;
          local_1f0 = 0;
          local_1e8._M_local_buf[0] = '\0';
          local_4d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_518._M_p;
          local_4d0._M_pi = p_Stack_510;
          __args_1_00 = p_Stack_510;
          __n_00 = this;
          local_1f8 = &local_1e8;
          (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                    ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_4c0,this,
                     (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_4f8);
          pIVar32 = pIStack_328;
          __first = local_330;
          if (pIStack_328 == local_320) {
            lVar56 = (long)pIStack_328 - (long)local_330;
            if (lVar56 == 0x7fffffffffffffe0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar36 = (lVar56 >> 4) * -0x5555555555555555;
            uVar45 = uVar36 + (uVar36 == 0);
            this_01 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       *)(uVar45 + uVar36);
            if ((_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                 *)0x2aaaaaaaaaaaaa9 < this_01) {
              this_01 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)0x2aaaaaaaaaaaaaa;
            }
            __alloc = (_Tp_alloc_type *)(uVar45 + uVar36);
            if (CARRY8(uVar45,uVar36)) {
              this_01 = (_Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                         *)0x2aaaaaaaaaaaaaa;
            }
            __result = std::
                       _Vector_base<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                       ::_M_allocate(this_01,(size_t)__n_00);
            std::allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::
            construct<(anonymous_namespace)::CompileData::IncludeEntry,(anonymous_namespace)::JBT<std::__cxx11::string>,bool_const&>
                      ((allocator_type *)(lVar56 + (long)__result),(IncludeEntry *)local_4c0,
                       (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_278,(bool *)__alloc);
            pIVar32 = std::
                      vector<(anonymous_namespace)::CompileData::IncludeEntry,_std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>_>
                      ::_S_relocate(__first,pIVar32,__result,__alloc);
            if (__first != (pointer)0x0) {
              operator_delete(__first,(long)local_320 - (long)__first);
            }
            local_320 = __result + (long)this_01;
            local_330 = __result;
          }
          else {
            std::allocator_traits<std::allocator<(anonymous_namespace)::CompileData::IncludeEntry>>
            ::
            construct<(anonymous_namespace)::CompileData::IncludeEntry,(anonymous_namespace)::JBT<std::__cxx11::string>,bool_const&>
                      ((allocator_type *)pIStack_328,(IncludeEntry *)local_4c0,
                       (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_278,(bool *)__args_1_00);
            pIVar32 = pIStack_328;
          }
          pIStack_328 = pIVar32 + 1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c0._0_8_ != &local_4b0) {
            operator_delete((void *)local_4c0._0_8_,local_4b0._M_allocated_capacity + 1);
          }
          if (local_4d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d0._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f8._0_8_ != &local_4e8) {
            operator_delete((void *)local_4f8._0_8_,local_4e8._M_allocated_capacity + 1);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_438);
        if (p_Stack_510 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_510);
        }
        pBVar47 = local_150;
        if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
          operator_delete((void *)local_538._0_8_,local_528._M_allocated_capacity + 1);
        }
        pBVar47 = pBVar47 + 1;
      } while (pBVar47 != local_158);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_allocated_capacity != &local_480) {
      operator_delete((void *)local_490._M_allocated_capacity,
                      (ulong)(local_480._M_allocated_capacity + 1));
    }
    local_438._0_8_ = local_438 + 0x10;
    local_538._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x13;
    local_438._0_8_ = std::__cxx11::string::_M_create((ulong *)local_438,(ulong)local_538);
    local_528._8_8_ = local_538 + 8;
    local_438._16_8_ = local_538._0_8_;
    *(undefined8 *)local_438._0_8_ = 0x5f454c49504d4f43;
    *(undefined8 *)(local_438._0_8_ + 8) = 0x4954494e49464544;
    builtin_strncpy((char *)(local_438._0_8_ + 0xf),"IONS",4);
    local_438._8_8_ = local_538._0_8_;
    *(char *)(local_538._0_8_ + local_438._0_8_) = '\0';
    local_538._8_8_ = local_538._8_8_ & 0xffffffff00000000;
    local_528._M_allocated_capacity = 0;
    p_Stack_510 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pBVar47 = (local_4c8->CompileDefinitions).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar10 = (local_4c8->CompileDefinitions).
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_518._M_p = (pointer)local_528._8_8_;
    if (pBVar47 != pBVar10) {
      p_Var6 = (_Rb_tree_node_base *)(local_4c0 + 8);
      do {
        local_4f8._0_8_ = &local_4e8;
        pcVar49 = (pBVar47->Value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4f8,pcVar49,pcVar49 + (pBVar47->Value)._M_string_length);
        local_4d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pBVar47->Backtrace).
                       super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
        local_4d0._M_pi =
             (pBVar47->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
             TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (local_4d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_4d0._M_pi)->_M_use_count = (local_4d0._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_4d0._M_pi)->_M_use_count = (local_4d0._M_pi)->_M_use_count + 1;
          }
        }
        local_278._0_8_ = local_278 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_278,local_4f8._0_8_,(char *)(local_4f8._0_8_ + local_4f8._8_8_));
        cmGeneratorExpressionInterpreter::Evaluate
                  ((cmGeneratorExpressionInterpreter *)&local_318,(string *)local_278,
                   (string *)local_438);
        std::__cxx11::string::_M_assign((string *)local_4f8);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        local_4c0._8_8_ = local_4c0._8_8_ & 0xffffffff00000000;
        local_4b0._M_allocated_capacity = 0;
        local_498 = 0;
        local_4b0._8_8_ = p_Var6;
        local_4a0 = p_Var6;
        cmLocalGenerator::AppendDefines
                  (localGenerator,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_4c0,(string *)local_4f8);
        for (uVar33 = local_4b0._8_8_; (_Rb_tree_node_base *)uVar33 != p_Var6;
            uVar33 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar33)) {
          local_1b8._M_allocated_capacity = (size_type)&local_1a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1b8,*(long *)(uVar33 + 0x20),
                     (long)&((_Rb_tree_node_base *)(uVar33 + 0x20))->_M_parent->_M_color +
                     *(long *)(uVar33 + 0x20));
          if (local_4d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4d0._M_pi)->_M_use_count = (local_4d0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4d0._M_pi)->_M_use_count = (local_4d0._M_pi)->_M_use_count + 1;
            }
          }
          local_490._M_allocated_capacity = (size_type)&local_480;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_allocated_capacity == &local_1a8) {
            local_480._8_8_ = local_1a8._8_8_;
          }
          else {
            local_490._M_allocated_capacity = local_1b8._M_allocated_capacity;
          }
          local_480._M_allocated_capacity._1_7_ = local_1a8._M_allocated_capacity._1_7_;
          local_480._M_local_buf[0] = local_1a8._M_local_buf[0];
          local_490._8_8_ = local_1b8._8_8_;
          local_1b8._8_8_ = (pointer)0x0;
          local_1a8._M_local_buf[0] = '\0';
          local_470 = local_4d8;
          local_468 = local_4d0._M_pi;
          local_1b8._M_allocated_capacity = (size_type)&local_1a8;
          std::
          _Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
          ::_M_insert_unique<BT<std::__cxx11::string>const&>
                    ((_Rb_tree<BT<std::__cxx11::string>,BT<std::__cxx11::string>,std::_Identity<BT<std::__cxx11::string>>,std::less<BT<std::__cxx11::string>>,std::allocator<BT<std::__cxx11::string>>>
                      *)local_538,
                     (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_490);
          if (local_468 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_490._M_allocated_capacity != &local_480) {
            operator_delete((void *)local_490._M_allocated_capacity,
                            (ulong)(local_480._M_allocated_capacity + 1));
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4c0);
        if (local_4d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4d0._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f8._0_8_ != &local_4e8) {
          operator_delete((void *)local_4f8._0_8_,local_4e8._M_allocated_capacity + 1);
        }
        pBVar47 = pBVar47 + 1;
      } while (pBVar47 != pBVar10);
    }
    local_4e8._8_8_ = local_4f8 + 8;
    local_4f8._8_8_ = local_4f8._8_8_ & 0xffffffff00000000;
    local_4e8._M_allocated_capacity = 0;
    local_4d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_4d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._8_8_;
    cmsys::SystemTools::UpperCase((string *)local_4c0,this->Config);
    plVar34 = (long *)std::__cxx11::string::replace((ulong)local_4c0,0,(char *)0x0,0x79ae90);
    local_490._M_allocated_capacity = (size_type)&local_480;
    paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar34 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar34 == paVar44) {
      local_480._M_allocated_capacity = paVar44->_M_allocated_capacity;
      local_480._8_8_ = plVar34[3];
    }
    else {
      local_480._M_allocated_capacity = paVar44->_M_allocated_capacity;
      local_490._M_allocated_capacity =
           (size_type)
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar34;
    }
    local_490._8_8_ = plVar34[1];
    *plVar34 = (long)paVar44;
    plVar34[1] = 0;
    *(undefined1 *)(plVar34 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._0_8_ != &local_4b0) {
      operator_delete((void *)local_4c0._0_8_,local_4b0._M_allocated_capacity + 1);
    }
    cVar30 = cmSourceFile::GetProperty(local_4c8,(string *)&local_490);
    if (cVar30.Value != (string *)0x0) {
      pcVar49 = ((cVar30.Value)->_M_dataplus)._M_p;
      local_128._M_allocated_capacity = (size_type)&local_118;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar49,pcVar49 + (cVar30.Value)->_M_string_length);
      psVar25 = cmGeneratorExpressionInterpreter::Evaluate
                          ((cmGeneratorExpressionInterpreter *)&local_318,(string *)&local_128,
                           (string *)local_438);
      cmLocalGenerator::AppendDefines
                (localGenerator,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_4f8,psVar25);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_allocated_capacity != &local_118) {
        operator_delete((void *)local_128._M_allocated_capacity,local_118._M_allocated_capacity + 1)
        ;
      }
    }
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)&p_Stack_510->_vptr__Sp_counted_base +
                 (long)&(local_4d0._M_pi)->_vptr__Sp_counted_base);
    std::
    vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve((vector<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_360,(size_type)paVar27);
    uVar33 = local_4e8._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._8_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_538 + 8)) {
      uVar35 = local_528._8_8_;
      do {
        (anonymous_namespace)::Target::ToJBT<std::__cxx11::string>
                  ((JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_4c0,this,
                   (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(uVar35 + 0x20));
        paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c0;
        std::
        vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
        ::emplace_back<(anonymous_namespace)::JBT<std::__cxx11::string>>
                  ((vector<(anonymous_namespace)::JBT<std::__cxx11::string>,std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>
                    *)&local_360,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_4c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c0._0_8_ != &local_4b0) {
          paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_4b0._M_allocated_capacity + 1);
          operator_delete((void *)local_4c0._0_8_,(ulong)paVar27);
        }
        uVar35 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar35);
        uVar33 = local_4e8._8_8_;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)uVar35 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_538 + 8));
    }
    for (; pJVar21 = pJStack_358, pJVar20 = local_360,
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)uVar33 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_4f8 + 8); uVar33 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar33)) {
      paVar50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(uVar33 + 0x20);
      local_4c0._0_4_ = 0xffffffff;
      if (pJStack_358 == local_350) {
        lVar56 = (long)pJStack_358 - (long)local_360;
        if (lVar56 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar36 = (lVar56 >> 3) * -0x3333333333333333;
        uVar45 = uVar36 + (uVar36 == 0);
        p_Var58 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(uVar45 + uVar36);
        if ((_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x333333333333332 < p_Var58) {
          p_Var58 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x333333333333333;
        }
        paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(uVar45 + uVar36);
        if (CARRY8(uVar45,uVar36)) {
          p_Var58 = (_Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)0x333333333333333;
        }
        pJVar37 = std::
                  _Vector_base<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<(anonymous_namespace)::JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::_M_allocate(p_Var58,(size_t)paVar27);
        std::allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
        construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string_const&,(anonymous_namespace)::JBTIndex>
                  ((allocator_type *)(lVar56 + (long)pJVar37),
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)paVar50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0,
                   (JBTIndex *)paVar44);
        pJVar38 = pJVar37;
        if (pJVar20 != pJVar21) {
          paVar27 = &(pJVar20->Value).field_2;
          paVar23 = &(pJVar37->Value).field_2;
          do {
            paVar57 = paVar23;
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar57 + -1))->
            _M_dataplus)._M_p = (pointer)paVar57;
            pcVar49 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (paVar27 + -1))->_M_dataplus)._M_p;
            if (paVar27 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar49) {
              sVar19 = *(size_type *)((long)paVar27 + 8);
              paVar57->_M_allocated_capacity = paVar27->_M_allocated_capacity;
              *(size_type *)((long)paVar57 + 8) = sVar19;
            }
            else {
              (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar57 + -1))
              ->_M_dataplus)._M_p = pcVar49;
              paVar57->_M_allocated_capacity = paVar27->_M_allocated_capacity;
            }
            *(size_type *)((long)paVar57 + -8) = *(size_type *)((long)paVar27 + -8);
            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar27 + -1))->
            _M_dataplus)._M_p = (pointer)paVar27;
            *(size_type *)((long)paVar27 + -8) = 0;
            paVar27->_M_local_buf[0] = '\0';
            *(undefined4 *)(paVar57 + 1) = *(undefined4 *)(paVar27 + 1);
            paVar44 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar27 + 0x28);
            pJVar38 = (pointer)((long)paVar27 + 0x18);
            paVar27 = paVar44;
            paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar57 + 0x28);
          } while (pJVar38 != pJVar21);
          pJVar38 = (pointer)((long)paVar57 + 0x18);
        }
        if (pJVar20 != (pointer)0x0) {
          paVar50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)((long)local_350 - (long)pJVar20);
          operator_delete(pJVar20,(ulong)paVar50);
        }
        local_350 = pJVar37 + (long)p_Var58;
        local_360 = pJVar37;
      }
      else {
        std::allocator_traits<std::allocator<(anonymous_namespace)::JBT<std::__cxx11::string>>>::
        construct<(anonymous_namespace)::JBT<std::__cxx11::string>,std::__cxx11::string_const&,(anonymous_namespace)::JBTIndex>
                  ((allocator_type *)pJStack_358,
                   (JBT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)paVar50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0,
                   (JBTIndex *)paVar44);
        pJVar38 = pJStack_358;
      }
      pJStack_358 = pJVar38 + 1;
      paVar27 = paVar50;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_allocated_capacity != &local_480) {
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_480._M_allocated_capacity + 1);
      operator_delete((void *)local_490._M_allocated_capacity,(ulong)paVar27);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_4f8);
    std::
    _Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_538);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_438 + 0x10)) {
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_438._16_8_ + 1);
      operator_delete((void *)local_438._0_8_,(ulong)paVar27);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_2b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(CONCAT17(local_460.field_2._M_local_buf[7],
                             local_460.field_2._M_allocated_capacity._0_7_) + 1);
      operator_delete(local_460._M_dataplus._M_p,(ulong)paVar27);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._32_8_ != &local_248) {
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(CONCAT35(local_248._M_allocated_capacity._5_3_,
                             local_248._M_allocated_capacity._0_5_) + 1);
      operator_delete((void *)local_278._32_8_,(ulong)paVar27);
    }
    if ((undefined1 *)local_308._56_8_ != local_308 + 0x48) {
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_308._72_8_ + 1);
      operator_delete((void *)local_308._56_8_,(ulong)paVar27);
    }
    if ((undefined1 *)local_308._16_8_ != local_308 + 0x20) {
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_308._32_8_ + 1);
      operator_delete((void *)local_308._16_8_,(ulong)paVar27);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_308);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_318);
  }
  this_00 = &this->CompileGroupMap;
  _Var39 = std::__detail::
           _Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
           ::_M_hash_code((_Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                           *)&local_3f0.bool_,(CompileData *)paVar27);
  VVar40.map_ = (ObjectValues *)
                std::
                _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::_M_find_node(&this_00->_M_h,_Var39 % (this->CompileGroupMap)._M_h._M_bucket_count,
                               (key_type *)&local_3f0,_Var39);
  if ((__node_ptr)VVar40.int_ == (__node_ptr)0x0) {
    pCVar11 = (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pCVar12 = (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_318 = (ValueHolder)this_00;
    VVar41.string_ = (char *)operator_new(0xf0);
    __k = local_380;
    *(_Hash_node_base **)VVar41.string_ = (_Hash_node_base *)0x0;
    __key = &((VVar41.map_)->_M_t)._M_impl.super__Rb_tree_header;
    pp_Var1 = &((VVar41.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    *(_Base_ptr **)&((VVar41.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = pp_Var1
    ;
    if (local_3f0 == &local_3e0) {
      *pp_Var1 = (_Base_ptr)CONCAT71(local_3e0.int_._1_7_,local_3e0.bool_);
      ((VVar41.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_3d8;
    }
    else {
      *(ValueHolder *)&__key->_M_header = (LargestInt)local_3f0;
      *pp_Var1 = (_Base_ptr)CONCAT71(local_3e0.int_._1_7_,local_3e0.bool_);
    }
    ((VVar41.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = local_3e8;
    local_3e8 = (_Base_ptr)0x0;
    local_3e0.bool_ = false;
    ((VVar41.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = (size_t)(VVar41.int_ + 0x38)
    ;
    if (local_3d0 == &local_3c0) {
      ((_Hash_node_base *)(VVar41.int_ + 0x38))->_M_nxt =
           (_Hash_node_base *)
           CONCAT71(local_3c0._M_allocated_capacity._1_7_,local_3c0._M_local_buf[0]);
      ((_Hash_node_base *)(VVar41.int_ + 0x40))->_M_nxt = (_Hash_node_base *)local_3c0._8_8_;
    }
    else {
      ((VVar41.map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_3d0;
      ((_Hash_node_base *)(VVar41.int_ + 0x38))->_M_nxt =
           (_Hash_node_base *)
           CONCAT71(local_3c0._M_allocated_capacity._1_7_,local_3c0._M_local_buf[0]);
    }
    ((_Hash_node_base *)(VVar41.int_ + 0x30))->_M_nxt = local_3c8;
    local_3c8 = (_Hash_node_base *)0x0;
    local_3c0._M_local_buf[0] = '\0';
    ((_Hash_node_base *)(VVar41.int_ + 0x48))->_M_nxt = (_Hash_node_base *)(VVar41.int_ + 0x58);
    if (local_3b0 == &local_3a0) {
      ((_Hash_node_base *)(VVar41.int_ + 0x58))->_M_nxt =
           (_Hash_node_base *)
           CONCAT71(local_3a0._M_allocated_capacity._1_7_,local_3a0._M_local_buf[0]);
      ((_Hash_node_base *)(VVar41.int_ + 0x60))->_M_nxt =
           (_Hash_node_base *)
           CONCAT17(local_3a0._M_local_buf[0xf],
                    CONCAT25(local_3a0._13_2_,CONCAT41(local_3a0._9_4_,local_3a0._M_local_buf[8])));
    }
    else {
      ((_Hash_node_base *)(VVar41.int_ + 0x48))->_M_nxt = (_Hash_node_base *)local_3b0;
      ((_Hash_node_base *)(VVar41.int_ + 0x58))->_M_nxt =
           (_Hash_node_base *)
           CONCAT71(local_3a0._M_allocated_capacity._1_7_,local_3a0._M_local_buf[0]);
    }
    ((_Hash_node_base *)(VVar41.int_ + 0x50))->_M_nxt = local_3a8;
    local_3a8 = (_Hash_node_base *)0x0;
    local_3a0._M_local_buf[0] = '\0';
    ((_Hash_node_base *)(VVar41.int_ + 0x68))->_M_nxt = local_390;
    ((_Hash_node_base *)(VVar41.int_ + 0x70))->_M_nxt = p_Stack_388;
    ((_Hash_node_base *)(VVar41.int_ + 0x78))->_M_nxt = (_Hash_node_base *)local_380;
    local_380 = (CompileData *)0x0;
    local_390 = (_Hash_node_base *)0x0;
    p_Stack_388 = (_Hash_node_base *)0x0;
    ((_Hash_node_base *)(VVar41.int_ + 0x80))->_M_nxt = (_Hash_node_base *)pJStack_378;
    ((_Hash_node_base *)(VVar41.int_ + 0x88))->_M_nxt = (_Hash_node_base *)local_370;
    ((_Hash_node_base *)(VVar41.int_ + 0x90))->_M_nxt = (_Hash_node_base *)pJStack_368;
    pJStack_368 = (pointer)0x0;
    pJStack_378 = (pointer)0x0;
    local_370 = (pointer)0x0;
    ((_Hash_node_base *)(VVar41.int_ + 0x98))->_M_nxt = (_Hash_node_base *)local_360;
    ((_Hash_node_base *)(VVar41.int_ + 0xa0))->_M_nxt = (_Hash_node_base *)pJStack_358;
    ((_Hash_node_base *)(VVar41.int_ + 0xa8))->_M_nxt = (_Hash_node_base *)local_350;
    local_350 = (pointer)0x0;
    local_360 = (pointer)0x0;
    pJStack_358 = (pointer)0x0;
    ((_Hash_node_base *)(VVar41.int_ + 0xb0))->_M_nxt = p_Stack_348;
    ((_Hash_node_base *)(VVar41.int_ + 0xb8))->_M_nxt = local_340;
    ((_Hash_node_base *)(VVar41.int_ + 0xc0))->_M_nxt = p_Stack_338;
    p_Stack_338 = (_Hash_node_base *)0x0;
    p_Stack_348 = (_Hash_node_base *)0x0;
    local_340 = (_Hash_node_base *)0x0;
    ((_Hash_node_base *)(VVar41.int_ + 200))->_M_nxt = (_Hash_node_base *)local_330;
    ((_Hash_node_base *)(VVar41.int_ + 0xd0))->_M_nxt = (_Hash_node_base *)pIStack_328;
    ((_Hash_node_base *)(VVar41.int_ + 0xd8))->_M_nxt = (_Hash_node_base *)local_320;
    local_320 = (pointer)0x0;
    local_330 = (pointer)0x0;
    pIStack_328 = (pointer)0x0;
    *(int *)&((_Hash_node_base *)(VVar41.int_ + 0xe0))->_M_nxt =
         (int)((ulong)((long)pCVar11 - (long)pCVar12) >> 4) * -0x55555555;
    local_3f0.string_ = (char *)&local_3e0;
    local_3d0.string_ = (char *)&local_3c0;
    local_3b0 = &local_3a0;
    local_310.string_ = VVar41.string_;
    _Var39 = std::__detail::
             _Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
             ::_M_hash_code((_Hash_code_base<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::__detail::_Select1st,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                             *)__key,__k);
    uVar36 = (this->CompileGroupMap)._M_h._M_bucket_count;
    uVar45 = _Var39 % uVar36;
    VVar40.map_ = (ObjectValues *)
                  std::
                  _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_M_find_node(&this_00->_M_h,uVar45,(key_type *)__key,_Var39);
    if ((__node_ptr)VVar40.int_ == (__node_ptr)0x0) {
      auVar61 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                          ((ulong)&(this->CompileGroupMap)._M_h._M_rehash_policy,uVar36,
                           (this->CompileGroupMap)._M_h._M_element_count);
      __n = auVar61._8_8_;
      if ((auVar61 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        if (__n == 1) {
          __s = &(this->CompileGroupMap)._M_h._M_single_bucket;
          (this->CompileGroupMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
        }
        else {
          __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                          ((new_allocator<std::__detail::_Hash_node_base_*> *)local_538,__n,
                           (void *)0x0);
          memset(__s,0,__n * 8);
        }
        _Var51._M_nxt = (this->CompileGroupMap)._M_h._M_before_begin._M_nxt;
        (this->CompileGroupMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        if (_Var51._M_nxt != (_Hash_node_base *)0x0) {
          p_Var2 = &(this->CompileGroupMap)._M_h._M_before_begin;
          uVar36 = 0;
          do {
            p_Var8 = (_Var51._M_nxt)->_M_nxt;
            uVar45 = (ulong)_Var51._M_nxt[0x1d]._M_nxt % __n;
            if (__s[uVar45] == (_Hash_node_base *)0x0) {
              (_Var51._M_nxt)->_M_nxt = p_Var2->_M_nxt;
              p_Var2->_M_nxt = _Var51._M_nxt;
              __s[uVar45] = p_Var2;
              if ((_Var51._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
                pp_Var42 = __s + uVar36;
                goto LAB_003b4790;
              }
            }
            else {
              (_Var51._M_nxt)->_M_nxt = __s[uVar45]->_M_nxt;
              pp_Var42 = &__s[uVar45]->_M_nxt;
              uVar45 = uVar36;
LAB_003b4790:
              *pp_Var42 = _Var51._M_nxt;
            }
            _Var51._M_nxt = p_Var8;
            uVar36 = uVar45;
          } while (p_Var8 != (_Hash_node_base *)0x0);
        }
        pp_Var13 = (this->CompileGroupMap)._M_h._M_buckets;
        if (&(this->CompileGroupMap)._M_h._M_single_bucket != pp_Var13) {
          operator_delete(pp_Var13,(this->CompileGroupMap)._M_h._M_bucket_count << 3);
        }
        (this->CompileGroupMap)._M_h._M_bucket_count = __n;
        (this->CompileGroupMap)._M_h._M_buckets = __s;
        uVar45 = _Var39 % __n;
      }
      ((_Hash_node_code_cache<true> *)(VVar41.int_ + 0xe8))->_M_hash_code = _Var39;
      pp_Var13 = (this_00->_M_h)._M_buckets;
      if (pp_Var13[uVar45] == (__node_base_ptr)0x0) {
        _Var51._M_nxt = (this->CompileGroupMap)._M_h._M_before_begin._M_nxt;
        *(_Hash_node_base **)VVar41.string_ = _Var51._M_nxt;
        (this->CompileGroupMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)VVar41;
        if (_Var51._M_nxt != (_Hash_node_base *)0x0) {
          ((ValueHolder *)
          (pp_Var13 +
          (ulong)_Var51._M_nxt[0x1d]._M_nxt % (this->CompileGroupMap)._M_h._M_bucket_count))->map_ =
               (ObjectValues *)VVar41;
        }
        (this_00->_M_h)._M_buckets[uVar45] = &(this->CompileGroupMap)._M_h._M_before_begin;
      }
      else {
        *(_Hash_node_base **)VVar41.string_ = pp_Var13[uVar45]->_M_nxt;
        ((ValueHolder *)pp_Var13[uVar45])->map_ = (ObjectValues *)VVar41;
      }
      psVar3 = &(this->CompileGroupMap)._M_h._M_element_count;
      *psVar3 = *psVar3 + 1;
      local_310.int_ = 0;
      VVar40.string_ = VVar41.string_;
    }
    std::
    _Hashtable<(anonymous_namespace)::CompileData,_std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>,_std::allocator<std::pair<const_(anonymous_namespace)::CompileData,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<(anonymous_namespace)::CompileData>,_std::hash<(anonymous_namespace)::CompileData>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Scoped_node::~_Scoped_node((_Scoped_node *)&local_318);
    local_318.int_ = 0;
    Json::Value::Value((Value *)&local_310,arrayValue);
    pVVar14 = (ValueHolder *)
              (this->CompileGroups).
              super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_318 = VVar40;
    if (pVVar14 ==
        (ValueHolder *)
        (this->CompileGroups).
        super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pVVar15 = (ValueHolder *)
                (this->CompileGroups).
                super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pVVar14 - (long)pVVar15 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar56 = (long)pVVar14 - (long)pVVar15 >> 4;
      uVar45 = lVar56 * -0x5555555555555555;
      uVar36 = 1;
      if (pVVar14 != pVVar15) {
        uVar36 = uVar45;
      }
      uVar48 = uVar36 + uVar45;
      if (0x2aaaaaaaaaaaaa9 < uVar48) {
        uVar48 = 0x2aaaaaaaaaaaaaa;
      }
      if (CARRY8(uVar36,uVar45)) {
        uVar48 = 0x2aaaaaaaaaaaaaa;
      }
      if (uVar48 == 0) {
        pVVar43 = (ValueHolder *)0x0;
      }
      else {
        pVVar43 = (ValueHolder *)operator_new(uVar48 * 0x30);
      }
      pVVar43[lVar56 * 2].map_ = (ObjectValues *)local_318;
      Json::Value::Value((Value *)(pVVar43 + lVar56 * 2 + 1),(Value *)&local_310);
      pVVar54 = pVVar43;
      for (pVVar59 = pVVar15; pVVar14 != pVVar59; pVVar59 = pVVar59 + 6) {
        *pVVar54 = *pVVar59;
        Json::Value::Value((Value *)(pVVar54 + 1),(Value *)(pVVar59 + 1));
        Json::Value::~Value((Value *)(pVVar59 + 1));
        pVVar54 = pVVar54 + 6;
      }
      if (pVVar15 != (ValueHolder *)0x0) {
        operator_delete(pVVar15,(long)(this->CompileGroups).
                                      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pVVar15);
      }
      (this->CompileGroups).
      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pVVar43;
      (this->CompileGroups).
      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)(pVVar54 + 6);
      (this->CompileGroups).
      super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pVVar43 + uVar48 * 6);
    }
    else {
      pVVar14->map_ = (ObjectValues *)VVar40;
      Json::Value::Value((Value *)(pVVar14 + 1),(Value *)&local_310);
      ppCVar4 = &(this->CompileGroups).
                 super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar4 = *ppCVar4 + 1;
    }
    Json::Value::~Value((Value *)&local_310);
  }
  uVar7 = *(uint *)(VVar40.int_ + 0xe0);
  pCVar11 = (this->CompileGroups).
            super__Vector_base<(anonymous_namespace)::Target::CompileGroup,_std::allocator<(anonymous_namespace)::Target::CompileGroup>_>
            ._M_impl.super__Vector_impl_data._M_start;
  Json::Value::Value((Value *)&local_318,local_43c);
  Json::Value::append(&pCVar11[uVar7].SourceIndexes,(Value *)&local_318);
  Json::Value::~Value((Value *)&local_318);
  value = *(UInt *)(VVar40.int_ + 0xe0);
  CompileData::~CompileData((CompileData *)&local_3f0);
  Json::Value::Value(&local_58,value);
  pVVar26 = Json::Value::operator[](__return_storage_ptr__,"compileGroupIndex");
  Json::Value::operator=(pVVar26,&local_58);
  Json::Value::~Value(&local_58);
LAB_003b4aad:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpSource(cmGeneratorTarget::SourceAndKind const& sk,
                               Json::ArrayIndex si)
{
  Json::Value source = Json::objectValue;

  std::string const path = sk.Source.Value->ResolveFullPath();
  source["path"] = RelativeIfUnder(this->TopSource, path);
  if (sk.Source.Value->GetIsGenerated()) {
    source["isGenerated"] = true;
  }
  this->AddBacktrace(source, sk.Source.Backtrace);

  if (cmSourceGroup* sg =
        this->GT->Makefile->FindSourceGroup(path, this->SourceGroupsLocal)) {
    source["sourceGroupIndex"] = this->AddSourceGroup(sg, si);
  }

  switch (sk.Kind) {
    case cmGeneratorTarget::SourceKindObjectSource: {
      source["compileGroupIndex"] =
        this->AddSourceCompileGroup(sk.Source.Value, si);
    } break;
    case cmGeneratorTarget::SourceKindAppManifest:
    case cmGeneratorTarget::SourceKindCertificate:
    case cmGeneratorTarget::SourceKindCustomCommand:
    case cmGeneratorTarget::SourceKindExternalObject:
    case cmGeneratorTarget::SourceKindExtra:
    case cmGeneratorTarget::SourceKindHeader:
    case cmGeneratorTarget::SourceKindIDL:
    case cmGeneratorTarget::SourceKindManifest:
    case cmGeneratorTarget::SourceKindModuleDefinition:
    case cmGeneratorTarget::SourceKindResx:
    case cmGeneratorTarget::SourceKindXaml:
    case cmGeneratorTarget::SourceKindUnityBatched:
      break;
  }

  return source;
}